

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_landscapes.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  size_t sVar1;
  uint uVar2;
  ostream *poVar3;
  size_type sVar4;
  reference ppcVar5;
  unsigned_long number_of_levels;
  char *pcVar6;
  string local_228 [32];
  stringstream local_208 [8];
  stringstream ss;
  ostream local_1f8 [376];
  undefined1 local_80 [8];
  Persistence_landscape l;
  size_t i_1;
  int local_3c;
  uint local_38;
  int i;
  uint dimension;
  int dim;
  vector<const_char_*,_std::allocator<const_char_*>_> filenames;
  char **argv_local;
  int argc_local;
  
  filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = argv;
  poVar3 = std::operator<<((ostream *)&std::clog,
                           "This program creates persistence landscapes files (*.land) of persistence diagrams files (*.pers) "
                          );
  poVar3 = std::operator<<(poVar3,"provided as an input.\n");
  poVar3 = std::operator<<(poVar3,
                           "The first parameter of this program is a dimension of persistence that will be used in creation of "
                          );
  poVar3 = std::operator<<(poVar3,"the persistence heat maps.");
  poVar3 = std::operator<<(poVar3,
                           "If your input files contains persistence pairs of various dimension, as a first parameter of the "
                          );
  poVar3 = std::operator<<(poVar3,
                           "procedure please provide the dimension of persistence you want to use.")
  ;
  poVar3 = std::operator<<(poVar3,
                           "If in your files there are only birth-death pairs of the same dimension, set the first parameter to "
                          );
  poVar3 = std::operator<<(poVar3,"-1.\n");
  std::operator<<(poVar3,
                  "The remaining parameters are the names of files with persistence diagrams. \n");
  if (argc < 3) {
    std::operator<<((ostream *)&std::clog,"Wrong parameter list, the program will now terminate \n")
    ;
    argv_local._4_4_ = 1;
  }
  else {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&dimension);
    uVar2 = atoi(filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage[1]);
    local_38 = std::numeric_limits<unsigned_int>::max();
    if (-1 < (int)uVar2) {
      local_38 = uVar2;
    }
    for (local_3c = 2; local_3c < argc; local_3c = local_3c + 1) {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)&dimension,
                 filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + local_3c);
    }
    l.number_of_functions_for_projections_to_reals = 0;
    while( true ) {
      sVar1 = l.number_of_functions_for_projections_to_reals;
      sVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)&dimension);
      if (sVar1 == sVar4) break;
      poVar3 = std::operator<<((ostream *)&std::clog,"Creating a landscape based on file : ");
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)&dimension,
                           l.number_of_functions_for_projections_to_reals);
      poVar3 = std::operator<<(poVar3,*ppcVar5);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)&dimension,
                           l.number_of_functions_for_projections_to_reals);
      pcVar6 = *ppcVar5;
      number_of_levels = std::numeric_limits<unsigned_long>::max();
      Gudhi::Persistence_representations::Persistence_landscape::Persistence_landscape
                ((Persistence_landscape *)local_80,pcVar6,(ulong)local_38,number_of_levels);
      std::__cxx11::stringstream::stringstream(local_208);
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)&dimension,
                           l.number_of_functions_for_projections_to_reals);
      poVar3 = std::operator<<(local_1f8,*ppcVar5);
      std::operator<<(poVar3,".land");
      std::__cxx11::stringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      Gudhi::Persistence_representations::Persistence_landscape::print_to_file
                ((Persistence_landscape *)local_80,pcVar6);
      std::__cxx11::string::~string(local_228);
      std::__cxx11::stringstream::~stringstream(local_208);
      Gudhi::Persistence_representations::Persistence_landscape::~Persistence_landscape
                ((Persistence_landscape *)local_80);
      l.number_of_functions_for_projections_to_reals =
           l.number_of_functions_for_projections_to_reals + 1;
    }
    argv_local._4_4_ = 0;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&dimension);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {
  std::clog << "This program creates persistence landscapes files (*.land) of persistence diagrams files (*.pers) "
            << "provided as an input.\n"
            << "The first parameter of this program is a dimension of persistence that will be used in creation of "
            << "the persistence heat maps."
            << "If your input files contains persistence pairs of various dimension, as a first parameter of the "
            << "procedure please provide the dimension of persistence you want to use."
            << "If in your files there are only birth-death pairs of the same dimension, set the first parameter to "
            << "-1.\n"
            << "The remaining parameters are the names of files with persistence diagrams. \n";

  if (argc < 3) {
    std::clog << "Wrong parameter list, the program will now terminate \n";
    return 1;
  }
  std::vector<const char*> filenames;
  int dim = atoi(argv[1]);
  unsigned dimension = std::numeric_limits<unsigned>::max();
  if (dim >= 0) {
    dimension = (unsigned)dim;
  }
  for (int i = 2; i < argc; ++i) {
    filenames.push_back(argv[i]);
  }

  for (size_t i = 0; i != filenames.size(); ++i) {
    std::clog << "Creating a landscape based on file : " << filenames[i] << std::endl;
    Persistence_landscape l(filenames[i], dimension);
    std::stringstream ss;
    ss << filenames[i] << ".land";
    l.print_to_file(ss.str().c_str());
  }
  return 0;
}